

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint32_t do_clcl(CPUS390XState_conflict *env,uint64_t *src1,uint64_t *src1len,uint64_t *src3,
                uint64_t *src3len,uint16_t pad,uint64_t limit,int wordsize,uintptr_t ra)

{
  uint64_t uVar1;
  undefined8 local_58;
  undefined2 local_50;
  undefined2 local_4e;
  undefined4 local_4c;
  uint16_t v3;
  uint16_t v1;
  uint32_t cc;
  uint64_t len;
  uint16_t pad_local;
  uint64_t *src3len_local;
  uint64_t *src3_local;
  uint64_t *src1len_local;
  uint64_t *src1_local;
  CPUS390XState_conflict *env_local;
  
  if (*src3len < *src1len) {
    local_58 = *src1len;
  }
  else {
    local_58 = *src3len;
  }
  _v3 = local_58;
  local_4c = 0;
  check_alignment(env,*src1len | *src3len,wordsize,ra);
  if (local_58 == 0) {
    env_local._4_4_ = 0;
  }
  else {
    if (limit < local_58) {
      _v3 = limit;
      local_4c = 3;
    }
    for (; _v3 != 0; _v3 = _v3 - (long)wordsize) {
      local_4e = pad;
      if (*src1len != 0) {
        uVar1 = cpu_ldusize_data_ra(env,*src1,wordsize,ra);
        local_4e = (uint16_t)uVar1;
      }
      local_50 = pad;
      if (*src3len != 0) {
        uVar1 = cpu_ldusize_data_ra(env,*src3,wordsize,ra);
        local_50 = (uint16_t)uVar1;
      }
      if (local_4e != local_50) {
        local_4c = 2;
        if (local_4e < local_50) {
          local_4c = 1;
        }
        break;
      }
      if (*src1len != 0) {
        *src1 = (long)wordsize + *src1;
        *src1len = *src1len - (long)wordsize;
      }
      if (*src3len != 0) {
        *src3 = (long)wordsize + *src3;
        *src3len = *src3len - (long)wordsize;
      }
    }
    env_local._4_4_ = local_4c;
  }
  return env_local._4_4_;
}

Assistant:

static inline uint32_t do_clcl(CPUS390XState *env,
                               uint64_t *src1, uint64_t *src1len,
                               uint64_t *src3, uint64_t *src3len,
                               uint16_t pad, uint64_t limit,
                               int wordsize, uintptr_t ra)
{
    uint64_t len = MAX(*src1len, *src3len);
    uint32_t cc = 0;

    check_alignment(env, *src1len | *src3len, wordsize, ra);

    if (!len) {
        return cc;
    }

    /* Lest we fail to service interrupts in a timely manner, limit the
       amount of work we're willing to do.  */
    if (len > limit) {
        len = limit;
        cc = 3;
    }

    for (; len; len -= wordsize) {
        uint16_t v1 = pad;
        uint16_t v3 = pad;

        if (*src1len) {
            v1 = cpu_ldusize_data_ra(env, *src1, wordsize, ra);
        }
        if (*src3len) {
            v3 = cpu_ldusize_data_ra(env, *src3, wordsize, ra);
        }

        if (v1 != v3) {
            cc = (v1 < v3) ? 1 : 2;
            break;
        }

        if (*src1len) {
            *src1 += wordsize;
            *src1len -= wordsize;
        }
        if (*src3len) {
            *src3 += wordsize;
            *src3len -= wordsize;
        }
    }

    return cc;
}